

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O2

int32_t zng_gzvprintf(gzFile file,char *format,__va_list_tag *va)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  uint uVar6;
  
  if (file == (gzFile)0x0) {
    return -2;
  }
  if (file[1].have != 0x79b1) {
    return -2;
  }
  if (*(int *)((long)&file[4].pos + 4) != 0) {
    return -2;
  }
  if (((int)file[1].pos != 0) || (iVar2 = gz_init((gz_state *)file), iVar2 != -1)) {
    if ((int)file[4].pos != 0) {
      *(undefined4 *)&file[4].pos = 0;
      iVar2 = gz_zero((gz_state *)file,(off64_t)file[4].next);
      if (iVar2 == -1) goto LAB_00118b5e;
    }
    uVar4 = (ulong)(uint)file[5].pos;
    if (uVar4 == 0) {
      puVar5 = *(uchar **)(file + 2);
      file[5].next = puVar5;
    }
    else {
      puVar5 = file[5].next;
    }
    puVar5 = puVar5 + uVar4;
    puVar5[(int)file[1].pos - 1] = '\0';
    uVar3 = vsnprintf((char *)puVar5,(ulong)(uint)file[1].pos,format,va);
    if (uVar3 == 0) {
      return 0;
    }
    uVar1 = (uint)file[1].pos;
    if (uVar1 <= uVar3) {
      return 0;
    }
    if (puVar5[uVar1 - 1] != '\0') {
      return 0;
    }
    uVar6 = (int)file[5].pos + uVar3;
    *(uint *)&file[5].pos = uVar6;
    file->pos = file->pos + (long)(int)uVar3;
    if (uVar6 < uVar1) {
      return uVar3;
    }
    *(uint *)&file[5].pos = uVar1;
    iVar2 = gz_comp((gz_state *)file,0);
    if (iVar2 != -1) {
      memmove(*(void **)(file + 2),(void *)((ulong)(uint)file[1].pos + (long)*(void **)(file + 2)),
              (ulong)(uVar6 - uVar1));
      file[5].next = *(uchar **)(file + 2);
      *(uint *)&file[5].pos = uVar6 - uVar1;
      return uVar3;
    }
  }
LAB_00118b5e:
  return *(int32_t *)((long)&file[4].pos + 4);
}

Assistant:

int Z_EXPORTVA PREFIX(gzvprintf)(gzFile file, const char *format, va_list va) {
    int len;
    unsigned left;
    char *next;
    gz_state *state;
    PREFIX3(stream) *strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return Z_STREAM_ERROR;

    /* make sure we have some buffer space */
    if (state->size == 0 && gz_init(state) == -1)
        return state->err;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* do the printf() into the input buffer, put length in len -- the input
       buffer is double-sized just for this function, so there is guaranteed to
       be state->size bytes available after the current contents */
    if (strm->avail_in == 0)
        strm->next_in = state->in;
    next = (char *)(state->in + (strm->next_in - state->in) + strm->avail_in);
    next[state->size - 1] = 0;
    len = vsnprintf(next, state->size, format, va);

    /* check that printf() results fit in buffer */
    if (len == 0 || (unsigned)len >= state->size || next[state->size - 1] != 0)
        return 0;

    /* update buffer and position, compress first half if past that */
    strm->avail_in += (unsigned)len;
    state->x.pos += len;
    if (strm->avail_in >= state->size) {
        left = strm->avail_in - state->size;
        strm->avail_in = state->size;
        if (gz_comp(state, Z_NO_FLUSH) == -1)
            return state->err;
        memmove(state->in, state->in + state->size, left);
        strm->next_in = state->in;
        strm->avail_in = left;
    }
    return len;
}